

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyTraceRaysAttribs(TraceRaysAttribs *Attribs)

{
  long *plVar1;
  VERIFY_SBT_FLAGS VVar2;
  Char *pCVar3;
  ulong uVar4;
  char (*in_RCX) [77];
  undefined1 local_c0 [8];
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  TraceRaysAttribs *Attribs_local;
  
  msg.field_2._8_8_ = Attribs;
  if (Attribs->pSBT == (IShaderBindingTable *)0x0) {
    FormatString<char[33],char[23]>
              ((string *)local_30,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"pSBT must not be null.",(char (*) [23])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [77])0x43e;
    DebugAssertionFailed
              (pCVar3,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x43e);
    std::__cxx11::string::~string((string *)local_30);
  }
  plVar1 = *(long **)msg.field_2._8_8_;
  VVar2 = operator|(VERIFY_SBT_FLAG_SHADER_ONLY,VERIFY_SBT_FLAG_TLAS);
  uVar4 = (**(code **)(*plVar1 + 0x40))(plVar1,VVar2);
  if ((uVar4 & 1) == 0) {
    FormatString<char[33],char[77]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])
               "not all shaders in SBT are bound or instance to shader mapping is incorrect.",in_RCX
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [77])0x442;
    DebugAssertionFailed
              (pCVar3,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x442);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (*(int *)(msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[33],char[29]>
              ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"DimensionX must not be zero.",(char (*) [29])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [77])0x445;
    DebugAssertionFailed
              (pCVar3,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x445);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if (*(int *)(msg.field_2._8_8_ + 0xc) == 0) {
    FormatString<char[33],char[29]>
              ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"DimensionY must not be zero.",(char (*) [29])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [77])0x446;
    DebugAssertionFailed
              (pCVar3,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x446);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if (*(int *)(msg.field_2._8_8_ + 0x10) == 0) {
    FormatString<char[33],char[29]>
              ((string *)local_c0,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"DimensionZ must not be zero.",(char (*) [29])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x447);
    std::__cxx11::string::~string((string *)local_c0);
  }
  return true;
}

Assistant:

bool VerifyTraceRaysAttribs(const TraceRaysAttribs& Attribs)
{
#define CHECK_TRACE_RAYS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Trace rays attribs are invalid: ", __VA_ARGS__)
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.pSBT != nullptr, "pSBT must not be null.");

#ifdef DILIGENT_DEVELOPMENT
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.pSBT->Verify(VERIFY_SBT_FLAG_SHADER_ONLY | VERIFY_SBT_FLAG_TLAS),
                             "not all shaders in SBT are bound or instance to shader mapping is incorrect.");
#endif // DILIGENT_DEVELOPMENT

    CHECK_TRACE_RAYS_ATTRIBS(Attribs.DimensionX != 0, "DimensionX must not be zero.");
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.DimensionY != 0, "DimensionY must not be zero.");
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.DimensionZ != 0, "DimensionZ must not be zero.");

#undef CHECK_TRACE_RAYS_ATTRIBS

    return true;
}